

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

bool __thiscall cfd::core::AbstractTxIn::IsCoinBase(AbstractTxIn *this)

{
  bool bVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_txid;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_txid,0x20,
             (allocator_type *)&local_50);
  if (this->vout_ == 0xffffffff) {
    Txid::GetData((ByteData *)&local_38,&this->txid_);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
                       (ByteData *)&local_38);
    bVar1 = ::std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
                              &empty_txid);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  }
  else {
    bVar1 = false;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&empty_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool AbstractTxIn::IsCoinBase() const {
  bool is_coinbase = false;
  std::vector<uint8_t> empty_txid(kByteData256Length);
  if ((vout_ == std::numeric_limits<uint32_t>::max()) &&
      (txid_.GetData().GetBytes() == empty_txid)) {
    is_coinbase = true;
  }
  return is_coinbase;
}